

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::CustomModel::MergePartialFromCodedStream
          (CustomModel *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  short extraout_AX;
  uint uVar6;
  int iVar7;
  uint extraout_EAX;
  uint32 uVar8;
  pair<int,_int> pVar9;
  uint uVar10;
  ulong uVar11;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
  parser;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
  local_88;
  ArenaStringPtr *local_48;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
  *local_40;
  MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *local_38;
  
  local_48 = &this->description_;
  local_38 = &this->parameters_;
  local_40 = &(this->parameters_).map_;
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar10 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) ||
           (uVar8 = (uint)bVar2, (~(uint)*pbVar1 & uVar10) < 0x80)) goto LAB_00517da5;
        uVar10 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = (ulong)uVar10 | 0x100000000;
    }
    else {
LAB_00517da5:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar11 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar8 | uVar11;
    }
    uVar10 = (uint)uVar11;
    if ((uVar11 & 0x100000000) == 0) {
LAB_00517d69:
      iVar7 = 7;
      if ((uVar10 & 7) != 4 && uVar10 != 0) {
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar10);
        if (bVar5) goto LAB_00517d91;
        iVar7 = 6;
      }
    }
    else {
      uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
      if (uVar6 == 0x1e) {
        if ((char)uVar11 != -0xe) goto LAB_00517d69;
        local_88.mf_ = local_38;
        local_88.map_ = local_40;
        local_88.key_._M_dataplus._M_p = (pointer)&local_88.key_.field_2;
        local_88.key_._M_string_length = 0;
        local_88.key_.field_2._M_local_buf[0] = '\0';
        local_88.entry_.ptr_ =
             (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
              *)0x0;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
          input->buffer_ = puVar4 + 1;
          bVar5 = true;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar5 = -1 < iVar7;
        }
        if ((((bVar5) &&
             (pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                (input,iVar7), -1 < (long)pVar9)) &&
            (bVar5 = google::protobuf::internal::
                     MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                     ::
                     Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
                     ::MergePartialFromCodedStream(&local_88,input), bVar5)) &&
           (bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                              (input,pVar9.first), bVar5)) {
          bVar5 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                            (local_88.key_._M_dataplus._M_p,(int)local_88.key_._M_string_length,
                             PARSE,"CoreML.Specification.CustomModel.ParametersEntry.key");
          iVar7 = 6;
          if (bVar5) {
            iVar7 = 0;
          }
        }
        else {
          bVar5 = false;
          iVar7 = 6;
        }
        if (local_88.entry_.ptr_ !=
            (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
             *)0x0) {
          (*((local_88.entry_.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.key_._M_dataplus._M_p != &local_88.key_.field_2) {
          operator_delete(local_88.key_._M_dataplus._M_p,
                          CONCAT71(local_88.key_.field_2._M_allocated_capacity._1_7_,
                                   local_88.key_.field_2._M_local_buf[0]) + 1);
        }
        if (bVar5 != false) goto LAB_00517d91;
      }
      else {
        if (uVar6 == 0x28) {
          MergePartialFromCodedStream();
          if ((short)extraout_EAX != 1) {
            if ((extraout_EAX & 0xffff) != 0) {
LAB_00517d9f:
              iVar7 = (int)local_88.mf_;
              goto LAB_00517d94;
            }
            goto LAB_00517d69;
          }
        }
        else {
          if ((uVar6 != 10) || (MergePartialFromCodedStream(), extraout_AX == 0)) goto LAB_00517d69;
          if (extraout_AX != 1) goto LAB_00517d9f;
        }
LAB_00517d91:
        iVar7 = 0;
      }
    }
LAB_00517d94:
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool CustomModel::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CustomModel)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string className = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_classname()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->classname().data(), this->classname().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomModel.className"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // map<string, .CoreML.Specification.CustomModel.CustomModelParamValue> parameters = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          CustomModel_ParametersEntry::Parser< ::google::protobuf::internal::MapFieldLite<
              CustomModel_ParametersEntry,
              ::std::string, ::CoreML::Specification::CustomModel_CustomModelParamValue,
              ::google::protobuf::internal::WireFormatLite::TYPE_STRING,
              ::google::protobuf::internal::WireFormatLite::TYPE_MESSAGE,
              0 >,
            ::google::protobuf::Map< ::std::string, ::CoreML::Specification::CustomModel_CustomModelParamValue > > parser(&parameters_);
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
              input, &parser));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            parser.key().data(), parser.key().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomModel.ParametersEntry.key"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string description = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_description()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->description().data(), this->description().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomModel.description"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CustomModel)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CustomModel)
  return false;
#undef DO_
}